

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O2

void __thiscall
copy_on_write<BaseType>::
copy_on_write<DerivedType,default_copy<DerivedType>,default_delete<DerivedType>,void>
          (copy_on_write<BaseType> *this,BaseType *u)

{
  bool bVar1;
  __uniq_ptr_impl<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
  local_20;
  
  (this->cb_).super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ptr_ = (BaseType *)0x0;
  (this->cb_).super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  if (u != (BaseType *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)u->_vptr_BaseType[-1],(type_info *)&DerivedType::typeinfo);
    if (!bVar1) {
      __assert_fail("typeid(*u) == typeid(U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jbcoe[P]copy_on_write/copy_on_write.h"
                    ,0xa6,
                    "copy_on_write<BaseType>::copy_on_write(U *, C, D) [T = BaseType, U = DerivedType, C = default_copy<DerivedType>, D = default_delete<DerivedType>, V = void]"
                   );
    }
    local_20._M_t.
    super__Tuple_impl<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
    .
    super__Head_base<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_false>
    ._M_head_impl =
         (tuple<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
          )operator_new(0x18);
    *(undefined ***)
     local_20._M_t.
     super__Tuple_impl<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
     .
     super__Head_base<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_false>
     ._M_head_impl = &PTR__indirect_shared_control_block_0018d3f0;
    *(BaseType **)
     ((long)local_20._M_t.
            super__Tuple_impl<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
            .
            super__Head_base<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_false>
            ._M_head_impl + 8) = u;
    std::__shared_ptr<shared_control_block<BaseType>,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<shared_control_block<BaseType>,(__gnu_cxx::_Lock_policy)2> *)&this->cb_
               ,(unique_ptr<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
                 *)&local_20);
    if ((_Tuple_impl<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
         )local_20._M_t.
          super__Tuple_impl<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
          .
          super__Head_base<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_false>
          ._M_head_impl !=
        (indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>
         *)0x0) {
      (**(code **)(*(long *)local_20._M_t.
                            super__Tuple_impl<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
                            .
                            super__Head_base<0UL,_indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    this->ptr_ = u;
  }
  return;
}

Assistant:

explicit copy_on_write(U* u, C copier = C{}, D deleter = D{})
  {
    if (!u)
    {
      return;
    }

    assert(typeid(*u) == typeid(U));

    cb_ = std::make_unique<indirect_shared_control_block<T, U, C, D>>(
        u, std::move(copier), std::move(deleter));
    ptr_ = u;
  }